

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O0

void __thiscall CEffects::Explosion(CEffects *this,vec2 Pos)

{
  vec2 Vel;
  vector4_base<float> b;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar1;
  int i;
  float a;
  int x;
  int y;
  CParticle p_1;
  CParticle p;
  vector2_base<float> *in_stack_fffffffffffffe68;
  float in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe74;
  CFlow *in_stack_fffffffffffffe78;
  vec2 in_stack_fffffffffffffe80;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_fffffffffffffe88;
  vector2_base<float> *in_stack_fffffffffffffe98;
  int local_150;
  int local_138;
  int local_134;
  undefined8 in_stack_fffffffffffffed8;
  vector4_base<float> in_stack_fffffffffffffee0;
  vector2_base<float> local_48;
  vector2_base<float> local_40;
  vector2_base<float> local_38;
  vector2_base<float> local_30;
  vector2_base<float> local_28;
  undefined1 local_20 [8];
  CCell *local_8;
  
  local_8 = *(CCell **)(in_FS_OFFSET + 0x28);
  for (local_134 = -8; local_134 < 9; local_134 = local_134 + 1) {
    for (local_138 = -8; local_138 < 9; local_138 = local_138 + 1) {
      if ((local_138 != 0) || (local_134 != 0)) {
        in_stack_fffffffffffffe78 = (CFlow *)&stack0xffffffffffffffe8;
        vector2_base<float>::vector2_base
                  ((vector2_base<float> *)in_stack_fffffffffffffe78,(float)local_138,
                   (float)local_134);
        aVar1.y = length((vector2_base<float> *)0x160cc5);
        in_stack_fffffffffffffe80 = (vec2)local_20;
        vector2_base<float>::vector2_base((vector2_base<float> *)in_stack_fffffffffffffe80,8.0,8.0);
        length((vector2_base<float> *)0x160cf2);
        vector2_base<float>::vector2_base(&local_30,(float)local_138,(float)local_134);
        local_28 = vector2_base<float>::operator*
                             ((vector2_base<float> *)in_stack_fffffffffffffe80,
                              (float)((ulong)in_stack_fffffffffffffe78 >> 0x20));
        vector2_base<float>::operator+
                  ((vector2_base<float> *)in_stack_fffffffffffffe80,
                   (vector2_base<float> *)in_stack_fffffffffffffe78);
        in_stack_fffffffffffffe98 = &local_48;
        vector2_base<float>::vector2_base
                  (in_stack_fffffffffffffe98,(float)local_138,(float)local_134);
        local_40 = normalize(in_stack_fffffffffffffe68);
        local_38 = vector2_base<float>::operator*
                             ((vector2_base<float> *)in_stack_fffffffffffffe80,
                              (float)((ulong)in_stack_fffffffffffffe78 >> 0x20));
        vector2_base<float>::operator*
                  ((vector2_base<float> *)in_stack_fffffffffffffe80,
                   (float)((ulong)in_stack_fffffffffffffe78 >> 0x20));
        Vel.field_1 = aVar1;
        Vel.field_0 = in_stack_fffffffffffffe88;
        CFlow::Add(in_stack_fffffffffffffe78,in_stack_fffffffffffffe80,Vel,in_stack_fffffffffffffe74
                  );
      }
    }
  }
  CParticle::CParticle((CParticle *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  CParticle::SetDefault((CParticle *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  random_float();
  CParticles::Add((CParticles *)in_stack_fffffffffffffe80,
                  (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                  (CParticle *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  for (local_150 = 0; local_150 < 0x18; local_150 = local_150 + 1) {
    CParticle::CParticle((CParticle *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))
    ;
    CParticle::SetDefault
              ((CParticle *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    RandomDir();
    random_float();
    in_stack_fffffffffffffe74 = 1.0;
    vector2_base<float>::operator*
              ((vector2_base<float> *)in_stack_fffffffffffffe80,
               (float)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    random_float();
    in_stack_fffffffffffffe70 = 0.5;
    random_float();
    random_float();
    vector4_base<float>::vector4_base
              ((vector4_base<float> *)&stack0xfffffffffffffee8,0.75,0.75,0.75,
               in_stack_fffffffffffffe74);
    vector4_base<float>::vector4_base
              ((vector4_base<float> *)&stack0xfffffffffffffed8,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe70,in_stack_fffffffffffffe74);
    random_float();
    b.field_2.z = SUB84(in_stack_fffffffffffffed8,0);
    b.field_3.w = SUB84(in_stack_fffffffffffffed8,4);
    b.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)(int)in_RDI;
    b.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)(int)((ulong)in_RDI >> 0x20);
    mix<vector4_base<float>,float>
              (in_stack_fffffffffffffee0,b,(float)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    CParticles::Add((CParticles *)in_stack_fffffffffffffe80,
                    (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                    (CParticle *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  }
  if (*(CCell **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEffects::Explosion(vec2 Pos)
{
	// add to flow
	for(int y = -8; y <= 8; y++)
		for(int x = -8; x <= 8; x++)
		{
			if(x == 0 && y == 0)
				continue;

			float a = 1 - (length(vec2(x,y)) / length(vec2(8,8)));
			m_pClient->m_pFlow->Add(Pos+vec2(x,y)*16, normalize(vec2(x,y))*5000.0f*a, 10.0f);
		}

	// add the explosion
	CParticle p;
	p.SetDefault();
	p.m_Spr = SPRITE_PART_EXPL01;
	p.m_Pos = Pos;
	p.m_LifeSpan = 0.4f;
	p.m_StartSize = 150.0f;
	p.m_EndSize = 0;
	p.m_Rot = random_float()*pi*2;
	m_pClient->m_pParticles->Add(CParticles::GROUP_EXPLOSIONS, &p);

	// add the smoke
	for(int i = 0; i < 24; i++)
	{
		CParticle p;
		p.SetDefault();
		p.m_Spr = SPRITE_PART_SMOKE;
		p.m_Pos = Pos;
		p.m_Vel = RandomDir() * ((1.0f + random_float()*0.2f) * 1000.0f);
		p.m_LifeSpan = 0.5f + random_float()*0.4f;
		p.m_StartSize = 32.0f + random_float()*8;
		p.m_EndSize = 0;
		p.m_Gravity = random_float()*-800.0f;
		p.m_Friction = 0.4f;
		p.m_Color = mix(vec4(0.75f,0.75f,0.75f,1.0f), vec4(0.5f,0.5f,0.5f,1.0f), random_float());
		m_pClient->m_pParticles->Add(CParticles::GROUP_GENERAL, &p);
	}
}